

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::CheckRPath(string *file,string *newRPath)

{
  StringEntry *have;
  size_type sVar1;
  bool bVar2;
  cmELF elf;
  cmELF cStack_38;
  
  cmELF::cmELF(&cStack_38,(file->_M_dataplus)._M_p);
  have = cmELF::GetRPath(&cStack_38);
  if (have == (StringEntry *)0x0) {
    have = cmELF::GetRunPath(&cStack_38);
  }
  if (newRPath->_M_string_length == 0) {
    if (have == (StringEntry *)0x0) {
      bVar2 = true;
      goto LAB_0035daa1;
    }
  }
  else if (have != (StringEntry *)0x0) {
    sVar1 = cmSystemToolsFindRPath(&have->Value,newRPath);
    bVar2 = true;
    if (sVar1 != 0xffffffffffffffff) goto LAB_0035daa1;
  }
  bVar2 = false;
LAB_0035daa1:
  cmELF::~cmELF(&cStack_38);
  return bVar2;
}

Assistant:

bool cmSystemTools::CheckRPath(std::string const& file,
                               std::string const& newRPath)
{
#if defined(CMAKE_USE_ELF_PARSER)
  // Parse the ELF binary.
  cmELF elf(file.c_str());

  // Get the RPATH or RUNPATH entry from it.
  cmELF::StringEntry const* se = elf.GetRPath();
  if(!se)
    {
    se = elf.GetRunPath();
    }

  // Make sure the current rpath contains the new rpath.
  if(newRPath.empty())
    {
    if(!se)
      {
      return true;
      }
    }
  else
    {
    if(se &&
       cmSystemToolsFindRPath(se->Value, newRPath) != std::string::npos)
      {
      return true;
      }
    }
  return false;
#else
  (void)file;
  (void)newRPath;
  return false;
#endif
}